

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void mov_eAXOv(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  int iVar2;
  UIntPtr UVar3;
  Int32 IVar4;
  uint uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char (*__src) [8];
  char (*pacVar9) [4];
  long lVar10;
  ulong uVar11;
  
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"mov",4);
  (pMyDisasm->Reserved_).MOD_ = 0;
  (pMyDisasm->Reserved_).RM_ = 5;
  iVar2 = (pMyDisasm->Reserved_).AddressSize;
  uVar11 = (pMyDisasm->Reserved_).EndOfBlock;
  UVar3 = (pMyDisasm->Reserved_).EIP_;
  if (iVar2 == 0x20) {
    if (uVar11 == 0 || UVar3 + 5 <= uVar11) {
      uVar11 = (ulong)*(uint *)(UVar3 + 1);
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.8X",uVar11);
      lVar6 = 5;
      goto LAB_0011027c;
    }
  }
  else if (iVar2 == 0x40) {
    if (uVar11 == 0 || UVar3 + 9 <= uVar11) {
      uVar11 = *(ulong *)(UVar3 + 1);
      CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.16llX",uVar11);
      lVar6 = 9;
LAB_0011027c:
      (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + lVar6;
      (pMyDisasm->Operand2).Memory.Displacement = uVar11;
      UVar1 = (pMyDisasm->Reserved_).REX.B_;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      if (UVar1 == '\0') {
        (pMyDisasm->Operand1).Registers.gpr = 1;
        iVar2 = (pMyDisasm->Reserved_).OperandSize;
        if (iVar2 == 0x40) {
          pacVar9 = Registers64Bits;
          goto LAB_00110316;
        }
        if (iVar2 == 0x20) {
          __src = Registers32Bits;
          goto LAB_001102f6;
        }
        __src = Registers16Bits;
LAB_00110324:
        IVar4 = 0x66;
      }
      else {
        (pMyDisasm->Operand1).Registers.gpr = 0x100;
        iVar2 = (pMyDisasm->Reserved_).OperandSize;
        if (iVar2 == 0x40) {
          pacVar9 = Registers64Bits + 8;
LAB_00110316:
          IVar4 = 0x68;
          __src = (char (*) [8])pacVar9;
        }
        else {
          if (iVar2 != 0x20) {
            __src = Registers16Bits + 8;
            goto LAB_00110324;
          }
          __src = Registers32Bits + 8;
LAB_001102f6:
          IVar4 = 0x67;
        }
      }
      (pMyDisasm->Reserved_).MemDecoration = IVar4;
      strcpy((pMyDisasm->Operand1).OpMnemonic,*__src);
      (pMyDisasm->Operand2).OpType = 0x30000;
      uVar5 = (pMyDisasm->Reserved_).MemDecoration - 0x66;
      if (2 < uVar5) {
        return;
      }
      uVar7 = *(undefined4 *)(&DAT_00145660 + (ulong)uVar5 * 4);
      lVar6 = 0x284;
      lVar10 = 0x1c0;
      uVar8 = uVar7;
      goto LAB_00110365;
    }
  }
  else if (uVar11 == 0 || UVar3 + 3 <= uVar11) {
    uVar11 = (ulong)*(ushort *)(UVar3 + 1);
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.4X",uVar11);
    lVar6 = 3;
    goto LAB_0011027c;
  }
  uVar8 = 0xfffffffe;
  lVar6 = 0x924;
  uVar7 = 1;
  lVar10 = 0x92d;
LAB_00110365:
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar10 + -0x14) = uVar7;
  *(undefined4 *)(pMyDisasm->CompleteInstr + lVar6 + -0x14) = uVar8;
  return;
}

Assistant:

void __bea_callspec__ mov_eAXOv(PDISASM pMyDisasm)
{
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mov");
    #endif
    GV.RM_ = 5;
    GV.MOD_= 0;
    if (GV.AddressSize == 64) {
        if (!Security(9, pMyDisasm)) return;
        MyAddress = *((UInt64 *) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.16llX",(Int64) MyAddress);
       #endif
       GV.EIP_+=9;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else if (GV.AddressSize == 32) {
        if (!Security(5, pMyDisasm)) return;
        MyAddress = *((UInt32*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.8X",(Int64) MyAddress);
       #endif
       GV.EIP_+=5;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }
    else {
        if (!Security(3, pMyDisasm)) return;
        MyAddress = *((UInt16*) (GV.EIP_+1));
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand2.OpMnemonic, "%.4X",(Int64) MyAddress);
       #endif
       GV.EIP_+=3;
       pMyDisasm->Operand2.Memory.Displacement = (Int64)MyAddress;
    }

    if (GV.REX.B_ == 0) {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0]);
            #endif
        }
    }
    else {
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG8;
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[0+8]);
            #endif
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[0+8]);
            #endif
        }
        else {
            GV.MemDecoration = Arg2word;
            #ifndef BEA_LIGHT_DISASSEMBLY
               (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[0+8]);
            #endif
        }
    }

    pMyDisasm->Operand2.OpType = MEMORY_TYPE ;
    if (GV.MemDecoration == 104) {
        pMyDisasm->Operand1.OpSize = 64;
        pMyDisasm->Operand2.OpSize = 64;
    }
    else if (GV.MemDecoration == 103) {
        pMyDisasm->Operand1.OpSize = 32;
        pMyDisasm->Operand2.OpSize = 32;
    }
    else if (GV.MemDecoration == 102) {
        pMyDisasm->Operand1.OpSize = 16;
        pMyDisasm->Operand2.OpSize = 16;
    }

}